

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O1

Ptr __thiscall
TgBot::Api::sendGame
          (Api *this,int64_t chatId,string *gameShortName,int32_t replyToMessageId,Ptr *replyMarkup,
          bool disableNotification)

{
  element_type *peVar1;
  undefined4 in_register_0000000c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000089;
  Ptr PVar2;
  char in_stack_00000008;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  bool local_8d;
  int local_8c;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> local_88;
  undefined1 local_70 [32];
  string *local_50;
  ptree local_48;
  
  local_8c = (int)replyMarkup;
  local_8d = (bool)in_stack_00000008;
  local_88.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = gameShortName;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&local_88,5);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
             (char (*) [8])0x2600ca,(long *)&local_50);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[16],std::__cxx11::string_const&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
             (char (*) [16])"game_short_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_0000000c,replyToMessageId));
  if (local_8c != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[20],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
               (char (*) [20])"reply_to_message_id",&local_8c);
  }
  peVar1 = *(element_type **)CONCAT71(in_register_00000089,disableNotification);
  if (peVar1 != (element_type *)0x0) {
    local_70._8_8_ = ((long *)CONCAT71(in_register_00000089,disableNotification))[1];
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count + 1;
      }
    }
    local_70._0_8_ = peVar1;
    TgTypeParser::parseGenericReply_abi_cxx11_
              (&local_48.m_data,(TgTypeParser *)(chatId + 0x28),(Ptr *)local_70);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[13],std::__cxx11::string>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
               (char (*) [13])"reply_markup",&local_48.m_data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.m_data._M_dataplus._M_p != &local_48.m_data.field_2) {
      operator_delete(local_48.m_data._M_dataplus._M_p);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
  }
  if (local_8d == true) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[21],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
               (char (*) [21])"disable_notification",&local_8d);
  }
  local_70._0_8_ = (element_type *)(local_70 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"sendGame","");
  sendRequest(&local_48,(Api *)chatId,(string *)local_70,&local_88);
  TgTypeParser::parseJsonAndGetMessage((TgTypeParser *)this,(ptree *)(chatId + 0x28));
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_48);
  if ((element_type *)local_70._0_8_ != (element_type *)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_);
  }
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&local_88);
  PVar2.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ptr)PVar2.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Message::Ptr Api::sendGame(int64_t chatId, const std::string& gameShortName, int32_t replyToMessageId, const InlineKeyboardMarkup::Ptr replyMarkup, bool disableNotification) const {
    vector<HttpReqArg> args;
    args.reserve(5);
    args.emplace_back("chat_id", chatId);
    args.emplace_back("game_short_name", gameShortName);
    if (replyToMessageId) {
        args.emplace_back("reply_to_message_id", replyToMessageId);
    }
    if (replyMarkup) {
        args.emplace_back("reply_markup", _tgTypeParser.parseGenericReply(replyMarkup));
    }
    if (disableNotification){
        args.emplace_back("disable_notification", disableNotification);
    }
    return _tgTypeParser.parseJsonAndGetMessage(sendRequest("sendGame", args));
}